

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

int32_t getDataBlock(UNewTrie2 *trie,UChar32 c,UBool forLSCP)

{
  UBool UVar1;
  int32_t iVar2;
  int i2_00;
  int32_t newBlock;
  int32_t oldBlock;
  int32_t i2;
  UBool forLSCP_local;
  UChar32 c_local;
  UNewTrie2 *trie_local;
  
  iVar2 = getIndex2Block(trie,c,forLSCP);
  if (iVar2 < 0) {
    trie_local._4_4_ = -1;
  }
  else {
    i2_00 = (c >> 5 & 0x3fU) + iVar2;
    trie_local._4_4_ = trie->index2[i2_00];
    UVar1 = isWritableBlock(trie,trie_local._4_4_);
    if (UVar1 == '\0') {
      trie_local._4_4_ = allocDataBlock(trie,trie_local._4_4_);
      if (trie_local._4_4_ < 0) {
        trie_local._4_4_ = -1;
      }
      else {
        setIndex2Entry(trie,i2_00,trie_local._4_4_);
      }
    }
  }
  return trie_local._4_4_;
}

Assistant:

static int32_t
getDataBlock(UNewTrie2 *trie, UChar32 c, UBool forLSCP) {
    int32_t i2, oldBlock, newBlock;

    i2=getIndex2Block(trie, c, forLSCP);
    if(i2<0) {
        return -1;  /* program error */
    }

    i2+=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
    oldBlock=trie->index2[i2];
    if(isWritableBlock(trie, oldBlock)) {
        return oldBlock;
    }

    /* allocate a new data block */
    newBlock=allocDataBlock(trie, oldBlock);
    if(newBlock<0) {
        /* out of memory in the data array */
        return -1;
    }
    setIndex2Entry(trie, i2, newBlock);
    return newBlock;
}